

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

void SHMfree(SHMPTR shmptr)

{
  undefined8 *puVar1;
  void *pvVar2;
  unsigned_long uVar3;
  SHMPTR *shmptr_ptr;
  SHM_POOL_SIZES sps;
  SHM_FIRST_HEADER *first_header;
  SHM_SEGMENT_HEADER *header;
  int offset;
  int segment;
  SHMPTR shmptr_local;
  
  if (shmptr == 0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    SHMLock();
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    puVar1 = (undefined8 *)SHMPtrToPtr(shmptr);
    if (puVar1 == (undefined8 *)0x0) {
      fprintf(_stderr,"] %s %s:%d","SHMfree",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x2ad);
      fprintf(_stderr,"Tried to free an invalid shared memory pointer 0x%08x\n",shmptr);
      SHMRelease();
    }
    else {
      pvVar2 = Volatile<void_*>::Load(shm_segment_bases + (int)((uint)(shmptr >> 0x18) & 0xff));
      shmptr_ptr._4_4_ = 0;
      while (((int)shmptr_ptr._4_4_ < 4 &&
             ((uVar3 = Volatile::operator_cast_to_unsigned_long
                                 ((Volatile *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 8)),
              shmptr < uVar3 ||
              (uVar3 = Volatile::operator_cast_to_unsigned_long
                                 ((Volatile *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 8 + 0x20)),
              uVar3 < shmptr))))) {
        shmptr_ptr._4_4_ = shmptr_ptr._4_4_ + 1;
      }
      if (shmptr_ptr._4_4_ == 4) {
        fprintf(_stderr,"] %s %s:%d","SHMfree",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                ,0x2c8);
        fprintf(_stderr,"Shared memory pointer 0x%08x is out of bounds!\n",shmptr);
        SHMRelease();
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        uVar3 = Volatile::operator_cast_to_unsigned_long
                          ((Volatile *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 8));
        if (((int)shmptr - (int)uVar3) % block_sizes[shmptr_ptr._4_4_] == 0) {
          pvVar2 = Volatile<void_*>::Load(shm_segment_bases);
          *puVar1 = *(undefined8 *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 0x18 + 0x58);
          *(SHMPTR *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 0x18 + 0x58) = shmptr;
          *(int *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 0x18 + 0x50) =
               *(int *)((long)pvVar2 + (ulong)shmptr_ptr._4_4_ * 0x18 + 0x50) + 1;
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SHMRelease();
        }
        else {
          fprintf(_stderr,"] %s %s:%d","SHMfree",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
                  ,0x2d8);
          fprintf(_stderr,"Shared memory pointer 0x%08x is misaligned!\n",shmptr);
          SHMRelease();
        }
      }
    }
  }
  return;
}

Assistant:

void SHMfree(SHMPTR shmptr)
{
    int segment;
    int offset;
    SHM_SEGMENT_HEADER *header;
    SHM_FIRST_HEADER *first_header;
    enum SHM_POOL_SIZES sps;
    SHMPTR *shmptr_ptr;

    if(0 == shmptr)
    {
        WARN("can't SHMfree() a NULL SHMPTR!\n");
        return;
    }
    SHMLock();

    TRACE("Releasing SHMPTR 0x%08x\n", shmptr);

    shmptr_ptr = static_cast<SHMPTR*>(SHMPTR_TO_PTR(shmptr));

    if(!shmptr_ptr)
    {
        ASSERT("Tried to free an invalid shared memory pointer 0x%08x\n", shmptr);
        SHMRelease();
        return;
    }

    /* note : SHMPTR_TO_PTR has already validated the segment/offset pair */
    segment = SHMPTR_SEGMENT(shmptr);
    header = (SHM_SEGMENT_HEADER *)shm_segment_bases[segment].Load();

    /* Find out the size of this block. Each segment tells where are its first
       and last blocks for each block size, so we simply need to check in which
       interval the block fits */
    for (sps = static_cast<SHM_POOL_SIZES>(0); sps < SPS_LAST;
         sps = static_cast<SHM_POOL_SIZES>(sps + 1))
    {
        if(header->first_pool_blocks[sps]<=shmptr &&
           header->last_pool_blocks[sps]>=shmptr)
        {
            break;
        }
    }

    /* If we didn't find an interval, then the block doesn't really belong in
       this segment (shouldn't happen, the offset check in SHMPTR_TO_PTR should
       have caught this.)  */
    if(sps == SPS_LAST)
    {
        ASSERT("Shared memory pointer 0x%08x is out of bounds!\n", shmptr);
        SHMRelease();
        return;
    }

    TRACE("SHMPTR 0x%08x is a %d-byte block located in segment %d\n",
          shmptr, block_sizes[sps], segment);

    /* Determine the offset of this block (in bytes) relative to the first
       block of the same size in this segment */
    offset = shmptr - header->first_pool_blocks[sps];

    /* Make sure that the offset is a multiple of the block size; otherwise,
       this isn't a real SHMPTR */
    if( 0 != ( offset % block_sizes[sps] ) )
    {
        ASSERT("Shared memory pointer 0x%08x is misaligned!\n", shmptr);
        SHMRelease();
        return;
    }

    /* Put the SHMPTR back in its pool. */
    first_header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* first_free is the head of a linked list of free SHMPTRs. All we need to
       do is make shmptr point to first_free, and set shmptr as the new head
       of the list. */
    *shmptr_ptr = first_header->pools[sps].first_free;
    first_header->pools[sps].first_free = shmptr;
    first_header->pools[sps].free_items++;

    TRACE("SHMPTR 0x%08x released; there are now %d blocks of %d bytes "
          "available\n", shmptr, first_header->pools[sps].free_items,
          block_sizes[sps]);
    SHMRelease();
}